

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall
capnp::AnyPointer::Builder::adopt<capnp::DynamicValue>
          (Builder *this,Orphan<capnp::DynamicValue> *orphan)

{
  Type TVar1;
  OrphanBuilder *value;
  Fault local_20;
  Fault f;
  Orphan<capnp::DynamicValue> *orphan_local;
  Builder *this_local;
  
  f.exception = (Exception *)orphan;
  TVar1 = Orphan<capnp::DynamicValue>::getType(orphan);
  if (FLOAT < TVar1) {
    if (2 < TVar1 - TEXT) {
      if (TVar1 == ENUM) goto LAB_00397bf1;
      if (2 < TVar1 - STRUCT) {
        return;
      }
    }
    value = kj::mv<capnp::_::OrphanBuilder>((OrphanBuilder *)&(f.exception)->file);
    _::PointerBuilder::adopt(&this->builder,value);
    return;
  }
LAB_00397bf1:
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
             ,0x7b1,FAILED,(char *)0x0,"\"AnyPointer cannot adopt primitive (non-object) value.\"",
             (char (*) [54])"AnyPointer cannot adopt primitive (non-object) value.");
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

void AnyPointer::Builder::adopt<DynamicValue>(Orphan<DynamicValue>&& orphan) {
  switch (orphan.getType()) {
    case DynamicValue::UNKNOWN:
    case DynamicValue::VOID:
    case DynamicValue::BOOL:
    case DynamicValue::INT:
    case DynamicValue::UINT:
    case DynamicValue::FLOAT:
    case DynamicValue::ENUM:
      KJ_FAIL_REQUIRE("AnyPointer cannot adopt primitive (non-object) value.");

    case DynamicValue::STRUCT:
    case DynamicValue::LIST:
    case DynamicValue::TEXT:
    case DynamicValue::DATA:
    case DynamicValue::CAPABILITY:
    case DynamicValue::ANY_POINTER:
      builder.adopt(kj::mv(orphan.builder));
      break;
  }
}